

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlockBase.h
# Opt level: O1

void __thiscall
dg::ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
          (ElemWithEdges<dg::dda::RWBBlock> *this,RWBBlock *s)

{
  pointer *pppRVar1;
  iterator iVar2;
  RWBBlock *pRVar3;
  RWBBlock **ppRVar4;
  EdgesT *__range2;
  bool bVar5;
  RWBBlock *local_18;
  RWBBlock *local_10;
  
  ppRVar4 = (this->_successors).
            super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar2._M_current =
       (this->_successors).
       super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar5 = ppRVar4 == iVar2._M_current;
  if (!bVar5) {
    pRVar3 = *ppRVar4;
    while (pRVar3 != s) {
      ppRVar4 = ppRVar4 + 1;
      bVar5 = ppRVar4 == iVar2._M_current;
      if (bVar5) goto LAB_00117c09;
      pRVar3 = *ppRVar4;
    }
    if (!bVar5) {
      return;
    }
  }
LAB_00117c09:
  local_18 = s;
  if (iVar2._M_current ==
      (this->_successors).
      super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>>::
    _M_realloc_insert<dg::dda::RWBBlock*const&>
              ((vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>> *)this,iVar2,&local_18
              );
  }
  else {
    *iVar2._M_current = s;
    pppRVar1 = &(this->_successors).
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  ppRVar4 = (local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._predecessors
            .super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                _predecessors.
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data + 8);
  bVar5 = ppRVar4 == iVar2._M_current;
  if (!bVar5) {
    if (&((*ppRVar4)->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
         super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock> != this ||
        *ppRVar4 == (RWBBlock *)0x0) {
      do {
        ppRVar4 = ppRVar4 + 1;
        bVar5 = ppRVar4 == iVar2._M_current;
        if (bVar5) goto LAB_00117c83;
      } while (&((*ppRVar4)->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock> != this
               || *ppRVar4 == (RWBBlock *)0x0);
    }
    if (!bVar5) {
      return;
    }
  }
LAB_00117c83:
  local_10 = (RWBBlock *)
             &this[-1]._predecessors.
              super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
               super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
               _predecessors.
               super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl
               .super__Vector_impl_data + 0x10)) {
    std::vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>>::
    _M_realloc_insert<dg::dda::RWBBlock*>
              ((vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>> *)
               &(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                _predecessors,iVar2,&local_10);
  }
  else {
    *iVar2._M_current = local_10;
    pppRVar1 = (pointer *)
               ((long)&(local_18->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                       super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                       _predecessors.
                       super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    *pppRVar1 = *pppRVar1 + 1;
  }
  return;
}

Assistant:

void addSuccessor(ElemT *s) {
        for (auto *succ : _successors) {
            if (succ == s)
                return;
        }

        _successors.push_back(s);

        for (auto *pred : s->_predecessors) {
            if (pred == this)
                return;
        }
        s->_predecessors.push_back(static_cast<ElemT *>(this));
    }